

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O2

string * __thiscall
glu::sl::ShaderParser::parseStringLiteral_abi_cxx11_
          (string *__return_storage_ptr__,ShaderParser *this,char *str)

{
  char cVar1;
  char cVar2;
  char *pcVar3;
  ostringstream o;
  ostringstream local_1a0 [376];
  
  cVar1 = *str;
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  pcVar3 = str + 1;
  while ((cVar2 = *pcVar3, cVar2 != cVar1 && (cVar2 != '\0'))) {
    if (cVar2 == '\\') {
      cVar2 = pcVar3[1];
      if (cVar2 != '\0') {
        if (cVar2 == 't') {
          cVar2 = '\t';
        }
        else if (cVar2 == 'n') {
          cVar2 = '\n';
        }
        std::operator<<((ostream *)local_1a0,cVar2);
      }
      pcVar3 = pcVar3 + 2;
    }
    else {
      std::operator<<((ostream *)local_1a0,cVar2);
      pcVar3 = pcVar3 + 1;
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

string ShaderParser::parseStringLiteral (const char* str)
{
	const char*		p		= str;
	char			endChar = *p++;
	ostringstream	o;

	while (*p != endChar && *p)
	{
		if (*p == '\\')
		{
			switch (p[1])
			{
				case 0:		DE_ASSERT(DE_FALSE);	break;
				case 'n':	o << '\n';				break;
				case 't':	o << '\t';				break;
				default:	o << p[1];				break;
			}

			p += 2;
		}
		else
			o << *p++;
	}

	return o.str();
}